

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

Branch * __thiscall
kj::ArrayBuilder<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::
add<kj::_::RaceSuccessfulPromiseNodeBase&,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
          (ArrayBuilder<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *this,
          RaceSuccessfulPromiseNodeBase *params,
          Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params_1,SourceLocation *params_2)

{
  Branch *pBVar1;
  PromiseArenaMember *local_10;
  
  pBVar1 = this->pos;
  local_10 = &params_1->ptr->super_PromiseArenaMember;
  params_1->ptr = (PromiseNode *)0x0;
  kj::_::RaceSuccessfulPromiseNodeBase::Branch::Branch
            (pBVar1,params,(PromiseNode *)&local_10,*params_2);
  if (local_10 != (PromiseArenaMember *)0x0) {
    kj::_::PromiseDisposer::dispose(local_10);
  }
  pBVar1 = this->pos;
  this->pos = pBVar1 + 1;
  return pBVar1;
}

Assistant:

T& add(Params&&... params) KJ_LIFETIMEBOUND {
    KJ_IREQUIRE(pos < endPtr, "Added too many elements to ArrayBuilder.");
    ctor(*pos, kj::fwd<Params>(params)...);
    return *pos++;
  }